

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzerSettings::PS2KeyboardAnalyzerSettings(PS2KeyboardAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  element_type *peVar2;
  AnalyzerSettingInterfaceNumberList *this_00;
  element_type *peVar3;
  ulong uVar4;
  Channel *pCVar5;
  uint uVar6;
  PS2KeyboardAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__PS2KeyboardAnalyzerSettings_00112d68;
  Channel::Channel(&this->mClockChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mDataChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mDeviceType = 0.0;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mClockChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mDataChannelInterface,(element_type *)0x0);
  uVar4 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mDeviceTypeInterface,(element_type *)0x0);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mClockChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Clock");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  pCVar5 = &this->mClockChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mDataChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Data");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
  pCVar5 = &this->mDataChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  this_00 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mDeviceTypeInterface,this_00);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDeviceTypeInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Device Type");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDeviceTypeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar3,"Keyboard");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDeviceTypeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar3,"Mouse (Standard PS/2)");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDeviceTypeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar3,"Mouse (IntelliMouse)");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mDeviceTypeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mDeviceType);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mClockChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mDataChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mDeviceTypeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x1);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x1,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  return;
}

Assistant:

PS2KeyboardAnalyzerSettings::PS2KeyboardAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ), mDataChannel( UNDEFINED_CHANNEL ), mDeviceType( 0 )
{
    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "Clock", "PS/2 - Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mDataChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mDataChannelInterface->SetTitleAndTooltip( "Data", "PS/2 - Data" );
    mDataChannelInterface->SetChannel( mDataChannel );

    mDeviceTypeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mDeviceTypeInterface->SetTitleAndTooltip( "Device Type", "Device Type" );
    mDeviceTypeInterface->AddNumber( 0, "Keyboard", "Keyboard" );
    mDeviceTypeInterface->AddNumber( 1, "Mouse (Standard PS/2)", "Mouse (Standard PS/2)" );
    mDeviceTypeInterface->AddNumber( 2, "Mouse (IntelliMouse)", "Mouse (IntelliMouse)" );
    mDeviceTypeInterface->SetNumber( mDeviceType );

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mDataChannelInterface.get() );
    AddInterface( mDeviceTypeInterface.get() );

    AddExportOption( 0, "Export captured keys as text file (Keyboard Only)" );
    AddExportExtension( 0, "text", "txt" );
    AddExportOption( 1, "Export data as .csv log file" );
    AddExportExtension( 1, "csv", "csv" );

    ClearChannels();
    AddChannel( mClockChannel, "PS/2 - Clock", false );
    AddChannel( mDataChannel, "PS/2 - Data", false );
}